

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSharedData::SetCircleTessellationMaxError(ImDrawListSharedData *this,float max_error)

{
  int iVar1;
  float fVar2;
  float fVar3;
  ImU8 local_2c;
  int local_18;
  float radius;
  int i;
  float max_error_local;
  ImDrawListSharedData *this_local;
  
  if ((this->CircleSegmentMaxError != max_error) ||
     (NAN(this->CircleSegmentMaxError) || NAN(max_error))) {
    if (max_error <= 0.0) {
      __assert_fail("max_error > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_draw.cpp"
                    ,0x187,"void ImDrawListSharedData::SetCircleTessellationMaxError(float)");
    }
    this->CircleSegmentMaxError = max_error;
    for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
      if (local_18 < 1) {
        local_2c = '0';
      }
      else {
        fVar2 = ImMin<float>(this->CircleSegmentMaxError,(float)local_18);
        fVar2 = acosf(1.0 - fVar2 / (float)local_18);
        fVar2 = ceilf(3.1415927 / fVar2);
        iVar1 = ImClamp<int>(((int)fVar2 + 1) / 2 << 1,4,0x200);
        local_2c = (ImU8)iVar1;
      }
      this->CircleSegmentCounts[local_18] = local_2c;
    }
    fVar2 = this->CircleSegmentMaxError;
    fVar3 = ImMax<float>(48.0,3.1415927);
    fVar3 = cosf(3.1415927 / fVar3);
    this->ArcFastRadiusCutoff = fVar2 / (1.0 - fVar3);
  }
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleTessellationMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;

    IM_ASSERT(max_error > 0.0f);
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = (float)i;
        CircleSegmentCounts[i] = (ImU8)((i > 0) ? IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError) : IM_DRAWLIST_ARCFAST_SAMPLE_MAX);
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}